

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void ImGui::SetCursorPos(ImVec2 *local_pos)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  ImVec2 IVar5;
  uint uVar6;
  ImVec2 IVar7;
  
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->Accessed = true;
  IVar5.y = ((pIVar4->Pos).y - (pIVar4->Scroll).y) + local_pos->y;
  IVar5.x = ((pIVar4->Pos).x - (pIVar4->Scroll).x) + local_pos->x;
  (pIVar4->DC).CursorPos = IVar5;
  fVar1 = (pIVar4->DC).CursorMaxPos.x;
  fVar2 = (pIVar4->DC).CursorPos.x;
  fVar3 = (pIVar4->DC).CursorPos.y;
  uVar6 = -(uint)(fVar2 <= fVar1);
  IVar7.x = (float)(~uVar6 & (uint)fVar2 | (uint)fVar1 & uVar6);
  fVar1 = (pIVar4->DC).CursorMaxPos.y;
  uVar6 = -(uint)(fVar3 <= fVar1);
  IVar7.y = (float)(~uVar6 & (uint)fVar3 | (uint)fVar1 & uVar6);
  (pIVar4->DC).CursorMaxPos = IVar7;
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->Accessed = true; return g.CurrentWindow; }